

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O2

ExprBlock * AnalyzeBlock(ExpressionContext *ctx,SynBlock *syntax,bool createScope)

{
  TypeBase *pTVar1;
  ScopeData *scopeData;
  ExprBase *pEVar2;
  int iVar3;
  ExprBase *pEVar4;
  undefined4 extraout_var;
  SynBase *pSVar6;
  FunctionData *onwerFunction;
  ExprBase *pEVar7;
  undefined4 extraout_var_00;
  undefined7 in_register_00000011;
  ExpressionContext *this;
  IntrusiveList<SynBase> *pIVar8;
  IntrusiveList<ExprBase> expressions;
  ExprBlock *pEVar5;
  
  if ((int)CONCAT71(in_register_00000011,createScope) == 0) {
    expressions.head = (ExprBase *)0x0;
    expressions.tail = (ExprBase *)0x0;
    pIVar8 = &syntax->expressions;
    while (pSVar6 = pIVar8->head, pSVar6 != (SynBase *)0x0) {
      pEVar4 = AnalyzeStatement(ctx,pSVar6);
      IntrusiveList<ExprBase>::push_back(&expressions,pEVar4);
      pIVar8 = (IntrusiveList<SynBase> *)&pSVar6->next;
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar5 = (ExprBlock *)CONCAT44(extraout_var_00,iVar3);
    pTVar1 = ctx->typeVoid;
    (pEVar5->super_ExprBase).typeID = 0x36;
    (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar5->super_ExprBase).type = pTVar1;
    (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar5->super_ExprBase).listed = false;
    (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002240b0;
    (pEVar5->expressions).head = expressions.head;
    (pEVar5->expressions).tail = expressions.tail;
    pEVar5->closures = (ExprBase *)0x0;
  }
  else {
    ExpressionContext::PushScope(ctx,SCOPE_EXPLICIT);
    expressions.head = (ExprBase *)0x0;
    expressions.tail = (ExprBase *)0x0;
    pIVar8 = &syntax->expressions;
    while (pSVar6 = pIVar8->head, pSVar6 != (SynBase *)0x0) {
      pEVar4 = AnalyzeStatement(ctx,pSVar6);
      IntrusiveList<ExprBase>::push_back(&expressions,pEVar4);
      pIVar8 = (IntrusiveList<SynBase> *)&pSVar6->next;
    }
    iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x48);
    pEVar2 = expressions.tail;
    pEVar4 = expressions.head;
    pEVar5 = (ExprBlock *)CONCAT44(extraout_var,iVar3);
    pTVar1 = ctx->typeVoid;
    this = ctx;
    pSVar6 = &ExpressionContext::MakeInternal(ctx,&syntax->super_SynBase)->super_SynBase;
    scopeData = ctx->scope;
    onwerFunction = ExpressionContext::GetCurrentFunction(this,scopeData);
    pEVar7 = CreateBlockUpvalueClose(ctx,pSVar6,onwerFunction,scopeData);
    (pEVar5->super_ExprBase).typeID = 0x36;
    (pEVar5->super_ExprBase).source = &syntax->super_SynBase;
    (pEVar5->super_ExprBase).type = pTVar1;
    (pEVar5->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar5->super_ExprBase).listed = false;
    (pEVar5->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002240b0;
    (pEVar5->expressions).head = pEVar4;
    (pEVar5->expressions).tail = pEVar2;
    pEVar5->closures = pEVar7;
    ExpressionContext::PopScope(ctx,SCOPE_EXPLICIT);
  }
  return pEVar5;
}

Assistant:

ExprBlock* AnalyzeBlock(ExpressionContext &ctx, SynBlock *syntax, bool createScope)
{
	if(createScope)
	{
		ctx.PushScope(SCOPE_EXPLICIT);

		IntrusiveList<ExprBase> expressions;

		for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
			expressions.push_back(AnalyzeStatement(ctx, expression));

		ExprBlock *block = new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, CreateBlockUpvalueClose(ctx, ctx.MakeInternal(syntax), ctx.GetCurrentFunction(ctx.scope), ctx.scope));

		ctx.PopScope(SCOPE_EXPLICIT);

		return block;
	}

	IntrusiveList<ExprBase> expressions;

	for(SynBase *expression = syntax->expressions.head; expression; expression = expression->next)
		expressions.push_back(AnalyzeStatement(ctx, expression));

	return new (ctx.get<ExprBlock>()) ExprBlock(syntax, ctx.typeVoid, expressions, NULL);
}